

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

int arm_mmu_idx_to_el_arm(ARMMMUIdx mmu_idx)

{
  ARMMMUIdx AVar1;
  
  if ((mmu_idx & ARMMMUIdx_MUser) == 0) {
    if (10 < mmu_idx - ARMMMUIdx_E10_0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                 ,0x2ce7,(char *)0x0);
    }
    AVar1 = *(ARMMMUIdx *)(&DAT_00b75f70 + (ulong)(mmu_idx - ARMMMUIdx_E10_0) * 4);
  }
  else {
    AVar1 = mmu_idx & 1;
  }
  return AVar1;
}

Assistant:

int arm_mmu_idx_to_el(ARMMMUIdx mmu_idx)
{
    if (mmu_idx & ARM_MMU_IDX_M) {
        return mmu_idx & ARM_MMU_IDX_M_PRIV;
    }

    switch (mmu_idx) {
    case ARMMMUIdx_E10_0:
    case ARMMMUIdx_E20_0:
    case ARMMMUIdx_SE10_0:
        return 0;
    case ARMMMUIdx_E10_1:
    case ARMMMUIdx_E10_1_PAN:
    case ARMMMUIdx_SE10_1:
    case ARMMMUIdx_SE10_1_PAN:
        return 1;
    case ARMMMUIdx_E2:
    case ARMMMUIdx_E20_2:
    case ARMMMUIdx_E20_2_PAN:
        return 2;
    case ARMMMUIdx_SE3:
        return 3;
    default:
        g_assert_not_reached();
        // never reach here
        return 0;
    }
}